

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

int png_icc_check_length
              (png_const_structrp png_ptr,png_colorspacerp colorspace,png_const_charp name,
              png_uint_32 profile_length)

{
  int iVar1;
  int iVar2;
  
  iVar1 = icc_check_length(png_ptr,colorspace,name,profile_length);
  iVar2 = 0;
  if (iVar1 != 0) {
    iVar2 = 1;
    if ((png_ptr->user_chunk_malloc_max != 0) &&
       (png_ptr->user_chunk_malloc_max < (ulong)profile_length)) {
      png_icc_profile_error
                (png_ptr,colorspace,name,(ulong)profile_length,"exceeds application limits");
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int /* bool */
icc_check_length(png_const_structrp png_ptr, png_colorspacerp colorspace,
    png_const_charp name, png_uint_32 profile_length)
{
   if (profile_length < 132)
      return png_icc_profile_error(png_ptr, colorspace, name, profile_length,
          "too short");
   return 1;
}